

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O0

FT_Error ft_svg_glyph_prepare(FT_Glyph svg_glyph,FT_GlyphSlot slot)

{
  undefined8 *puVar1;
  FT_SVG_Document document;
  FT_Memory memory;
  FT_Glyph pFStack_28;
  FT_Error error;
  FT_SvgGlyph glyph;
  FT_GlyphSlot slot_local;
  FT_Glyph svg_glyph_local;
  
  memory._4_4_ = 0;
  pFStack_28 = svg_glyph;
  glyph = (FT_SvgGlyph)slot;
  slot_local = (FT_GlyphSlot)svg_glyph;
  puVar1 = (undefined8 *)
           ft_mem_alloc(svg_glyph->library->memory,0x80,(FT_Error *)((long)&memory + 4));
  if (memory._4_4_ == 0) {
    *puVar1 = pFStack_28[1].library;
    puVar1[1] = pFStack_28[1].clazz;
    memcpy(puVar1 + 2,&pFStack_28[1].advance,0x38);
    *(undefined2 *)(puVar1 + 9) = *(undefined2 *)&pFStack_28[3].library;
    *(undefined2 *)((long)puVar1 + 0x4a) = *(undefined2 *)((long)&pFStack_28[3].library + 2);
    *(undefined2 *)((long)puVar1 + 0x4c) = *(undefined2 *)((long)&pFStack_28[3].library + 4);
    puVar1[10] = pFStack_28[3].clazz;
    puVar1[0xb] = *(undefined8 *)&pFStack_28[3].format;
    puVar1[0xc] = pFStack_28[3].advance.x;
    puVar1[0xd] = pFStack_28[3].advance.y;
    puVar1[0xe] = pFStack_28[4].library;
    puVar1[0xf] = pFStack_28[4].clazz;
    *(undefined4 *)&(glyph->transform).yx = 0x53564720;
    *(FT_Glyph_Format *)&(glyph->root).advance.x = pFStack_28[1].format;
    glyph[1].metrics.max_advance = (FT_Pos)puVar1;
    svg_glyph_local._4_4_ = memory._4_4_;
  }
  else {
    svg_glyph_local._4_4_ = memory._4_4_;
  }
  return svg_glyph_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  ft_svg_glyph_prepare( FT_Glyph      svg_glyph,
                        FT_GlyphSlot  slot )
  {
    FT_SvgGlyph  glyph = (FT_SvgGlyph)svg_glyph;

    FT_Error   error  = FT_Err_Ok;
    FT_Memory  memory = svg_glyph->library->memory;

    FT_SVG_Document  document = NULL;


    if ( FT_NEW( document ) )
      return error;

    document->svg_document        = glyph->svg_document;
    document->svg_document_length = glyph->svg_document_length;

    document->metrics      = glyph->metrics;
    document->units_per_EM = glyph->units_per_EM;

    document->start_glyph_id = glyph->start_glyph_id;
    document->end_glyph_id   = glyph->end_glyph_id;

    document->transform = glyph->transform;
    document->delta     = glyph->delta;

    slot->format      = FT_GLYPH_FORMAT_SVG;
    slot->glyph_index = glyph->glyph_index;
    slot->other       = document;

    return error;
  }